

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StreamExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StreamExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::StreamExpressionWithRangeSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,StreamExpressionWithRangeSyntax **args_1)

{
  StreamExpressionWithRangeSyntax *pSVar1;
  StreamExpressionSyntax *pSVar2;
  
  pSVar2 = (StreamExpressionSyntax *)allocate(this,0x28,8);
  pSVar1 = *args_1;
  (pSVar2->super_SyntaxNode).kind = StreamExpression;
  (pSVar2->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pSVar2->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pSVar2->expression).ptr = args;
  pSVar2->withRange = pSVar1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pSVar2;
  if (pSVar1 != (StreamExpressionWithRangeSyntax *)0x0) {
    (pSVar1->super_SyntaxNode).parent = (SyntaxNode *)pSVar2;
  }
  return pSVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }